

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

void __thiscall
dg::dda::MemorySSATransformation::addDefinitionsFromCalledValue
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWNode *calledValue)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> defs;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions D;
  undefined8 *local_108;
  undefined8 *puStack_100;
  long local_f8;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_f0;
  Definitions local_c0;
  
  local_108 = (undefined8 *)0x0;
  puStack_100 = (undefined8 *)0x0;
  local_f8 = 0;
  local_c0.definitions._definitions._M_h._M_buckets =
       &local_c0.definitions._definitions._M_h._M_single_bucket;
  local_c0._processed = false;
  local_c0.definitions._definitions._M_h._M_bucket_count = 1;
  local_c0.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0.definitions._definitions._M_h._M_element_count = 0;
  local_c0.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
  local_c0.kills._definitions._M_h._M_buckets = &local_c0.kills._definitions._M_h._M_single_bucket;
  local_c0.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_c0.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c0.kills._definitions._M_h._M_bucket_count = 1;
  local_c0.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0.kills._definitions._M_h._M_element_count = 0;
  local_c0.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
  local_c0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_c0.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Definitions::update(&local_c0,calledValue,(RWNode *)0x0);
  Definitions::get((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&local_f0,&local_c0,ds);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&local_108,puStack_100,
             local_f0._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_f0._M_impl.super__Rb_tree_header);
  addUncoveredFromPredecessors
            (this,(C->super_RWNode).bblock,&local_c0,ds,
             (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_108);
  puVar1 = puStack_100;
  (phi->defuse)._init = true;
  if (local_108 != puStack_100) {
    puVar2 = local_108;
    do {
      RWNode::DefUses::add(&phi->defuse,(RWNode *)*puVar2);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase(&local_f0,(_Link_type)local_f0._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_c0.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.unknownWrites.
                    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_c0.kills);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_c0.definitions);
  if (local_108 != (undefined8 *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return;
}

Assistant:

void MemorySSATransformation::addDefinitionsFromCalledValue(
        RWNode *phi, RWNodeCall *C, const DefSite &ds, RWNode *calledValue) {
    std::vector<RWNode *> defs;
    Definitions D;
    // FIXME: cache this somehow ?
    D.update(calledValue);

    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    defs.insert(defs.end(), defSet.begin(), defSet.end());
    addUncoveredFromPredecessors(C->getBBlock(), D, ds, defs);
    phi->addDefUse(defs);
}